

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              JavascriptString *replace,bool noResult)

{
  bool bVar1;
  Var pvVar2;
  JavascriptRegExp *regularExpression;
  char16_t *varName;
  
  if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols == true) {
    bVar1 = IsRegexSymbolReplaceObservable(thisObj,scriptContext);
    if (bVar1) {
      pvVar2 = RegexEs6ReplaceImpl(scriptContext,thisObj,input,replace,false);
      return pvVar2;
    }
  }
  varName = L"String.prototype.replace";
  if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols != false) {
    varName = L"RegExp.prototype[Symbol.replace]";
  }
  regularExpression = JavascriptRegExp::ToRegExp(thisObj,varName,scriptContext);
  pvVar2 = RegexEs5ReplaceImpl(scriptContext,regularExpression,input,replace,noResult);
  return pvVar2;
}

Assistant:

Var RegexHelper::RegexReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        ScriptConfiguration const * scriptConfig = scriptContext->GetConfig();

        if (scriptConfig->IsES6RegExSymbolsEnabled() && IsRegexSymbolReplaceObservable(thisObj, scriptContext))
        {
            return RegexEs6ReplaceImpl(scriptContext, thisObj, input, replace, noResult);
        }
        else
        {
            PCWSTR varName = scriptConfig->IsES6RegExSymbolsEnabled()
                ? _u("RegExp.prototype[Symbol.replace]")
                : _u("String.prototype.replace");
            JavascriptRegExp* regularExpression = JavascriptRegExp::ToRegExp(thisObj, varName, scriptContext);
            return RegexEs5ReplaceImpl(scriptContext, regularExpression, input, replace, noResult);
        }
    }